

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

int * __thiscall matchit::impl::Id<int>::internalValue(Id<int> *this)

{
  BlockT *this_00;
  int *piVar1;
  Id<int> *this_local;
  
  this_00 = block(this);
  piVar1 = IdBlock<int>::get(this_00);
  return piVar1;
}

Assistant:

constexpr decltype(auto) internalValue() const { return block().get(); }